

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O2

JSON * __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
::operator[](QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>_>
  _Var1;
  _Variadic_union<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  local_48;
  undefined8 local_28;
  
  _Var1 = QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>::
          find<std::__cxx11::string>
                    ((QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>
                      *)this,s);
  if (_Var1._M_current ==
      (this->data).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    grow(this);
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._M_first._M_storage = (_Uninitialized<std::nullptr_t,_true>)(void *)0x0;
    local_48._8_8_ = 0;
    local_28 = 0;
    _Var1._M_current =
         std::
         vector<std::pair<std::__cxx11::string,chaiscript::json::JSON>,std::allocator<std::pair<std::__cxx11::string,chaiscript::json::JSON>>>
         ::emplace_back<std::__cxx11::string_const&,chaiscript::json::JSON>
                   ((vector<std::pair<std::__cxx11::string,chaiscript::json::JSON>,std::allocator<std::pair<std::__cxx11::string,chaiscript::json::JSON>>>
                     *)&this->data,s,(JSON *)&local_48._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
    ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                         *)&local_48._M_first);
  }
  return &(_Var1._M_current)->second;
}

Assistant:

Value &operator[](const Key &s) {
      const auto itr = find(s);
      if (itr != data.end()) {
        return itr->second;
      } else {
        grow();
        return data.emplace_back(s, Value()).second;
      }
    }